

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<kj::Promise<kj::Maybe<kj::HttpHeaders::Request>_>_> * __thiscall
kj::_::NullableValue<kj::Promise<kj::Maybe<kj::HttpHeaders::Request>_>_>::operator=
          (NullableValue<kj::Promise<kj::Maybe<kj::HttpHeaders::Request>_>_> *this,
          NullableValue<kj::Promise<kj::Maybe<kj::HttpHeaders::Request>_>_> *other)

{
  Promise<kj::Maybe<kj::HttpHeaders::Request>_> *params;
  NullableValue<kj::Promise<kj::Maybe<kj::HttpHeaders::Request>_>_> *other_local;
  NullableValue<kj::Promise<kj::Maybe<kj::HttpHeaders::Request>_>_> *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<kj::Promise<kj::Maybe<kj::HttpHeaders::Request>>>(&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      params = mv<kj::Promise<kj::Maybe<kj::HttpHeaders::Request>>>(&(other->field_1).value);
      ctor<kj::Promise<kj::Maybe<kj::HttpHeaders::Request>>,kj::Promise<kj::Maybe<kj::HttpHeaders::Request>>>
                (&(this->field_1).value,params);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }